

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O2

void __thiscall
tlx::CmdlineParser::add_bytes(CmdlineParser *this,string *longkey,uint64_t *dest,string *desc)

{
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"",&local_49);
  add_bytes(this,'\0',longkey,&local_48,dest,desc);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void CmdlineParser::add_bytes(const std::string& longkey,
                              uint64_t& dest, const std::string& desc) {
    return add_bytes(0, longkey, "", dest, desc);
}